

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  __m256i c;
  __m256i c_00;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m256i *ptr;
  __m256i *palVar19;
  __m256i *b;
  __m256i *ptr_00;
  __m256i *b_00;
  __m256i *ptr_01;
  __m256i *b_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  int64_t *ptr_04;
  long lVar20;
  long lVar21;
  ulong uVar22;
  longlong lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  longlong lVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  longlong lVar40;
  uint uVar41;
  ulong size;
  ulong uVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  int iVar49;
  ulong uVar50;
  uint uVar51;
  __m256i *palVar52;
  ulong uVar53;
  ulong uVar54;
  int iVar55;
  undefined8 uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar85 [16];
  ulong uVar84;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffc40 [28];
  undefined4 in_stack_fffffffffffffc5c;
  __m256i *local_368;
  __m256i *local_360;
  __m256i *local_358;
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_striped_profile_avx2_256_64_cold_1();
        }
        else {
          iVar15 = uVar5 - 1;
          size = (ulong)uVar5 + 3 >> 2;
          uVar41 = (uint)size;
          iVar16 = iVar15 / (int)uVar41;
          uVar34 = iVar15 % (int)uVar41;
          uVar27 = CONCAT44(0,open);
          iVar46 = -open;
          iVar25 = ppVar7->min;
          pvVar8 = (profile->profile64).matches;
          pvVar9 = (profile->profile64).similar;
          uVar38 = 0x8000000000000000 - (long)iVar25;
          if (iVar25 != iVar46 && SBORROW4(iVar25,iVar46) == iVar25 + open < 0) {
            uVar38 = uVar27 | 0x8000000000000000;
          }
          iVar25 = ppVar7->max;
          ppVar18 = parasail_result_new_stats();
          if (ppVar18 != (parasail_result_t *)0x0) {
            ppVar18->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x4810802;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar19 = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            b_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign___m256i(0x20,size);
            b_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            b_02 = parasail_memalign___m256i(0x20,size);
            b_03 = parasail_memalign___m256i(0x20,size);
            b_04 = parasail_memalign___m256i(0x20,size);
            ptr_04 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_04 != (int64_t *)0x0 && b_04 != (__m256i *)0x0) &&
                ((b_03 != (__m256i *)0x0 &&
                 (b_02 != (__m256i *)0x0 && (ptr_03 != (__m256i *)0x0 && ptr_02 != (__m256i *)0x0)))
                && ((b_01 != (__m256i *)0x0 && (ptr_01 != (__m256i *)0x0 && b_00 != (__m256i *)0x0))
                   && ((ptr_00 != (__m256i *)0x0 && b != (__m256i *)0x0) &&
                      (palVar19 != (__m256i *)0x0 && ptr != (__m256i *)0x0))))) {
              iVar17 = s2Len + -1;
              iVar24 = 3 - iVar16;
              uVar48 = CONCAT44(0,gap);
              auVar62._8_4_ = gap;
              auVar62._0_8_ = uVar48;
              auVar62._12_4_ = 0;
              auVar62._16_4_ = gap;
              auVar62._20_4_ = 0;
              auVar62._24_4_ = gap;
              auVar62._28_4_ = 0;
              lVar20 = uVar38 + 1;
              lVar37 = 0x7ffffffffffffffe - (long)iVar25;
              alVar1[3]._4_4_ = in_stack_fffffffffffffc5c;
              alVar1._0_28_ = in_stack_fffffffffffffc40;
              parasail_memset___m256i(b,alVar1,size);
              alVar2[3]._4_4_ = in_stack_fffffffffffffc5c;
              alVar2._0_28_ = in_stack_fffffffffffffc40;
              parasail_memset___m256i(b_00,alVar2,size);
              alVar3[3]._4_4_ = in_stack_fffffffffffffc5c;
              alVar3._0_28_ = in_stack_fffffffffffffc40;
              parasail_memset___m256i(b_01,alVar3,size);
              alVar4[3]._4_4_ = in_stack_fffffffffffffc5c;
              alVar4._0_28_ = in_stack_fffffffffffffc40;
              parasail_memset___m256i(b_02,alVar4,size);
              c[3]._4_4_ = in_stack_fffffffffffffc5c;
              c._0_28_ = in_stack_fffffffffffffc40;
              parasail_memset___m256i(b_03,c,size);
              c_00[3]._4_4_ = in_stack_fffffffffffffc5c;
              c_00._0_28_ = in_stack_fffffffffffffc40;
              parasail_memset___m256i(b_04,c_00,size);
              lVar21 = (long)iVar46;
              uVar38 = 0;
              do {
                lVar44 = 0;
                lVar43 = lVar21;
                do {
                  lVar47 = lVar43;
                  if (s1_beg != 0) {
                    lVar47 = 0;
                  }
                  local_80[lVar44] = lVar47;
                  local_a0[lVar44] = lVar47 - uVar27;
                  lVar44 = lVar44 + 1;
                  lVar43 = lVar43 - size * uVar48;
                } while (lVar44 != 4);
                palVar52 = ptr + uVar38;
                (*palVar52)[0] = local_80[0];
                (*palVar52)[1] = local_80[1];
                (*palVar52)[2] = local_80[2];
                (*palVar52)[3] = local_80[3];
                palVar52 = ptr_03 + uVar38;
                (*palVar52)[0] = local_a0[0];
                (*palVar52)[1] = local_a0[1];
                (*palVar52)[2] = local_a0[2];
                (*palVar52)[3] = local_a0[3];
                uVar38 = uVar38 + 1;
                lVar21 = lVar21 - uVar48;
              } while (uVar38 != size);
              *ptr_04 = 0;
              uVar38 = 1;
              iVar25 = iVar46;
              do {
                iVar49 = 0;
                if (s2_beg == 0) {
                  iVar49 = iVar25;
                }
                ptr_04[uVar38] = (long)iVar49;
                uVar38 = uVar38 + 1;
                iVar25 = iVar25 - gap;
              } while (s2Len + 1 != uVar38);
              uVar35 = uVar41 - 1;
              uVar38 = 1;
              if (1 < s2Len) {
                uVar38 = (ulong)(uint)s2Len;
              }
              lVar21 = (ulong)(uVar41 + (uVar41 == 0)) << 5;
              uVar48 = 0;
              auVar64._8_8_ = lVar20;
              auVar64._0_8_ = lVar20;
              auVar64._16_8_ = lVar20;
              auVar64._24_8_ = lVar20;
              auVar104 = ZEXT3264(auVar64);
              auVar77 = ZEXT3264(auVar64);
              auVar83 = ZEXT3264(auVar64);
              auVar91 = ZEXT3264(auVar64);
              auVar96 = ZEXT3264(auVar64);
              auVar99 = ZEXT3264(CONCAT824(lVar37,CONCAT816(lVar37,CONCAT88(lVar37,lVar37))));
              iVar25 = iVar17;
              do {
                local_358 = ptr_00;
                local_360 = ptr_01;
                local_368 = ptr_02;
                palVar52 = ptr;
                ptr_01 = b_00;
                ptr_02 = b_01;
                ptr_00 = b;
                ptr = palVar19;
                alVar1 = palVar52[uVar35];
                alVar2 = ptr_00[uVar35];
                alVar3 = ptr_01[uVar35];
                alVar4 = ptr_02[uVar35];
                auVar58 = alVar1._0_16_;
                auVar95._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar58;
                auVar95._16_16_ = ZEXT116(0) * alVar1._16_16_ + ZEXT116(1) * auVar58;
                auVar64 = vpalignr_avx2((undefined1  [32])alVar1,auVar95,8);
                auVar95 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                auVar95 = vpalignr_avx2((undefined1  [32])alVar2,auVar95,8);
                auVar11 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                auVar11 = vpalignr_avx2((undefined1  [32])alVar3,auVar11,8);
                auVar105 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                auVar105 = vpalignr_avx2((undefined1  [32])alVar4,auVar105,8);
                auVar64 = vpblendd_avx2(auVar64,ZEXT832((ulong)ptr_04[uVar48]),3);
                lVar43 = (long)ppVar7->mapper[(byte)s2[uVar48]] * size * 0x20;
                auVar106 = ZEXT864(0) << 0x40;
                lVar44 = 0;
                auVar108 = ZEXT3264(CONCAT824(1,CONCAT816(1,CONCAT88(1,1))));
                auVar107 = ZEXT864(0) << 0x40;
                auVar109 = ZEXT3264(CONCAT824(lVar20,CONCAT816(lVar20,CONCAT88(lVar20,lVar20))));
                do {
                  auVar64 = vpaddq_avx2(auVar64,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar44 + lVar43));
                  uVar22 = auVar64._0_8_;
                  uVar32 = *(ulong *)((long)*ptr_03 + lVar44);
                  if ((long)uVar32 < (long)uVar22) {
                    uVar32 = uVar22;
                  }
                  uVar45 = *(ulong *)((long)*ptr_03 + lVar44 + 8);
                  uVar28 = vpextrq_avx(auVar64._0_16_,1);
                  if ((long)uVar45 < (long)uVar28) {
                    uVar45 = uVar28;
                  }
                  uVar53 = auVar64._16_8_;
                  uVar28 = *(ulong *)((long)*ptr_03 + lVar44 + 0x10);
                  if ((long)uVar28 < (long)uVar53) {
                    uVar28 = uVar53;
                  }
                  uVar50 = *(ulong *)((long)*ptr_03 + lVar44 + 0x18);
                  uVar29 = vpextrq_avx(auVar64._16_16_,1);
                  if ((long)uVar50 < (long)uVar29) {
                    uVar50 = uVar29;
                  }
                  uVar29 = auVar109._0_8_;
                  if ((long)uVar32 <= (long)uVar29) {
                    uVar32 = uVar29;
                  }
                  uVar30 = vpextrq_avx(auVar109._0_16_,1);
                  if ((long)uVar45 <= (long)uVar30) {
                    uVar45 = uVar30;
                  }
                  uVar30 = auVar109._16_8_;
                  if ((long)uVar28 <= (long)uVar30) {
                    uVar28 = uVar30;
                  }
                  uVar31 = vpextrq_avx(auVar109._16_16_,1);
                  auVar63 = *(undefined1 (*) [32])((long)*ptr_03 + lVar44);
                  if ((long)uVar50 <= (long)uVar31) {
                    uVar50 = uVar31;
                  }
                  auVar72 = *(undefined1 (*) [32])((long)*b_04 + lVar44);
                  auVar58._8_8_ = 0;
                  auVar58._0_8_ = uVar50;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = uVar28;
                  auVar58 = vpunpcklqdq_avx(auVar92,auVar58);
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = uVar45;
                  auVar112._8_8_ = 0;
                  auVar112._0_8_ = uVar32;
                  auVar92 = vpunpcklqdq_avx(auVar112,auVar93);
                  auVar76._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92;
                  auVar58 = ZEXT116(1) * auVar58;
                  auVar76._16_16_ = auVar58;
                  auVar111 = *(undefined1 (*) [32])((long)*b_02 + lVar44);
                  auVar98 = *(undefined1 (*) [32])((long)*b_03 + lVar44);
                  *(undefined1 (*) [32])((long)*ptr + lVar44) = auVar76;
                  auVar82._0_8_ = -(ulong)(auVar76._0_8_ == uVar22);
                  auVar82._8_8_ = -(ulong)(auVar76._8_8_ == auVar64._8_8_);
                  auVar82._16_8_ = -(ulong)(auVar58._0_8_ == uVar53);
                  auVar82._24_8_ = -(ulong)(auVar58._8_8_ == auVar64._24_8_);
                  auVar90._0_8_ = -(ulong)(auVar76._0_8_ == uVar29);
                  auVar90._8_8_ = -(ulong)(auVar76._8_8_ == auVar109._8_8_);
                  auVar90._16_8_ = -(ulong)(auVar58._0_8_ == uVar30);
                  auVar90._24_8_ = -(ulong)(auVar58._8_8_ == auVar109._24_8_);
                  auVar64 = vblendvpd_avx(auVar111,auVar107._0_32_,auVar90);
                  auVar95 = vpaddq_avx2(auVar95,*(undefined1 (*) [32])
                                                 ((long)pvVar8 + lVar44 + lVar43));
                  auVar64 = vblendvpd_avx(auVar64,auVar95,auVar82);
                  *(undefined1 (*) [32])((long)*local_358 + lVar44) = auVar64;
                  auVar95 = vblendvpd_avx(auVar98,auVar106._0_32_,auVar90);
                  auVar11 = vpaddq_avx2(auVar11,*(undefined1 (*) [32])
                                                 ((long)pvVar9 + lVar44 + lVar43));
                  auVar95 = vblendvpd_avx(auVar95,auVar11,auVar82);
                  auVar11 = vblendvpd_avx(auVar72,auVar108._0_32_,auVar90);
                  auVar90 = vpcmpeqd_avx2(auVar90,auVar90);
                  auVar105 = vpsubq_avx2(auVar105,auVar90);
                  auVar11 = vblendvpd_avx(auVar11,auVar105,auVar82);
                  uVar22 = auVar99._0_8_;
                  if ((long)uVar32 <= (long)auVar99._0_8_) {
                    uVar22 = uVar32;
                  }
                  uVar53 = vpextrq_avx(auVar99._0_16_,1);
                  if ((long)uVar45 <= (long)uVar53) {
                    uVar53 = uVar45;
                  }
                  uVar29 = auVar99._16_8_;
                  if ((long)uVar28 <= (long)auVar99._16_8_) {
                    uVar29 = uVar28;
                  }
                  uVar30 = vpextrq_avx(auVar99._16_16_,1);
                  if ((long)uVar50 <= (long)uVar30) {
                    uVar30 = uVar50;
                  }
                  if ((long)uVar32 < (long)auVar104._0_8_) {
                    uVar32 = auVar104._0_8_;
                  }
                  uVar31 = vpextrq_avx(auVar104._0_16_,1);
                  if ((long)uVar45 < (long)uVar31) {
                    uVar45 = uVar31;
                  }
                  if ((long)uVar28 < (long)auVar104._16_8_) {
                    uVar28 = auVar104._16_8_;
                  }
                  uVar31 = vpextrq_avx(auVar104._16_16_,1);
                  if ((long)uVar50 < (long)uVar31) {
                    uVar50 = uVar31;
                  }
                  if ((long)uVar32 <= (long)auVar64._0_8_) {
                    uVar32 = auVar64._0_8_;
                  }
                  uVar31 = vpextrq_avx(auVar64._0_16_,1);
                  if ((long)uVar45 <= (long)uVar31) {
                    uVar45 = uVar31;
                  }
                  if ((long)uVar28 <= (long)auVar64._16_8_) {
                    uVar28 = auVar64._16_8_;
                  }
                  uVar31 = vpextrq_avx(auVar64._16_16_,1);
                  if ((long)uVar50 <= (long)uVar31) {
                    uVar50 = uVar31;
                  }
                  if ((long)uVar32 <= (long)auVar95._0_8_) {
                    uVar32 = auVar95._0_8_;
                  }
                  uVar31 = vpextrq_avx(auVar95._0_16_,1);
                  if ((long)uVar45 <= (long)uVar31) {
                    uVar45 = uVar31;
                  }
                  if ((long)uVar28 <= (long)auVar95._16_8_) {
                    uVar28 = auVar95._16_8_;
                  }
                  uVar31 = vpextrq_avx(auVar95._16_16_,1);
                  if ((long)uVar50 <= (long)uVar31) {
                    uVar50 = uVar31;
                  }
                  if ((long)uVar32 <= (long)auVar11._0_8_) {
                    uVar32 = auVar11._0_8_;
                  }
                  uVar31 = vpextrq_avx(auVar11._0_16_,1);
                  if ((long)uVar45 <= (long)uVar31) {
                    uVar45 = uVar31;
                  }
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar29;
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar30;
                  auVar58 = vpunpcklqdq_avx(auVar78,auVar85);
                  if ((long)uVar28 <= (long)auVar11._16_8_) {
                    uVar28 = auVar11._16_8_;
                  }
                  uVar29 = vpextrq_avx(auVar11._16_16_,1);
                  if ((long)uVar50 <= (long)uVar29) {
                    uVar50 = uVar29;
                  }
                  auVar105._8_4_ = open;
                  auVar105._0_8_ = uVar27;
                  auVar105._12_4_ = 0;
                  auVar105._16_4_ = open;
                  auVar105._20_4_ = 0;
                  auVar105._24_4_ = open;
                  auVar105._28_4_ = 0;
                  auVar105 = vpsubq_avx2(auVar76,auVar105);
                  auVar63 = vpsubq_avx2(auVar63,auVar62);
                  uVar30 = auVar105._0_8_;
                  uVar29 = auVar63._0_8_;
                  if ((long)auVar63._0_8_ < (long)uVar30) {
                    uVar29 = uVar30;
                  }
                  uVar39 = vpextrq_avx(auVar105._0_16_,1);
                  uVar31 = vpextrq_avx(auVar63._0_16_,1);
                  if ((long)uVar31 < (long)uVar39) {
                    uVar31 = uVar39;
                  }
                  uVar84 = auVar105._16_8_;
                  uVar54 = vpextrq_avx(auVar105._16_16_,1);
                  uVar42 = auVar63._16_8_;
                  if ((long)auVar63._16_8_ < (long)uVar84) {
                    uVar42 = uVar84;
                  }
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = uVar53;
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = uVar22;
                  auVar92 = vpunpcklqdq_avx(auVar100,auVar97);
                  uVar22 = vpextrq_avx(auVar63._16_16_,1);
                  if ((long)uVar22 < (long)uVar54) {
                    uVar22 = uVar54;
                  }
                  auVar99 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                ZEXT116(1) * auVar58,
                                                ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92));
                  auVar86._8_8_ = 0;
                  auVar86._0_8_ = uVar29;
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = uVar31;
                  auVar58 = vpunpcklqdq_avx(auVar86,auVar101);
                  *(undefined1 (*) [32])((long)*local_360 + lVar44) = auVar95;
                  *(undefined1 (*) [32])((long)*local_368 + lVar44) = auVar11;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar22;
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = uVar42;
                  auVar92 = vpunpcklqdq_avx(auVar102,auVar79);
                  auVar90 = vpcmpgtq_avx2(auVar105,auVar63);
                  auVar63 = vblendvpd_avx(auVar111,auVar64,auVar90);
                  auVar98 = vblendvpd_avx(auVar98,auVar95,auVar90);
                  auVar111 = vpcmpeqd_avx2(auVar111,auVar111);
                  auVar76 = vpsubq_avx2(auVar72,auVar111);
                  auVar111 = vpsubq_avx2(auVar11,auVar111);
                  auVar72 = vpcmpeqd_avx2(auVar11,auVar11);
                  auVar11 = vblendvpd_avx(auVar76,auVar111,auVar90);
                  *(undefined1 (*) [16])((long)*ptr_03 + lVar44 + 0x10) = auVar92;
                  *(undefined1 (*) [16])((long)*ptr_03 + lVar44) = auVar58;
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = uVar28;
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = uVar50;
                  auVar58 = vpunpcklqdq_avx(auVar87,auVar94);
                  *(undefined1 (*) [32])((long)*b_02 + lVar44) = auVar63;
                  auVar63 = vpsubq_avx2(auVar109._0_32_,auVar62);
                  uVar22 = auVar63._0_8_;
                  if ((long)auVar63._0_8_ < (long)uVar30) {
                    uVar22 = uVar30;
                  }
                  uVar28 = vpextrq_avx(auVar63._0_16_,1);
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = uVar45;
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = uVar32;
                  auVar92 = vpunpcklqdq_avx(auVar110,auVar88);
                  uVar32 = vpextrq_avx(auVar63._16_16_,1);
                  if ((long)uVar28 < (long)uVar39) {
                    uVar28 = uVar39;
                  }
                  uVar45 = auVar63._16_8_;
                  if ((long)auVar63._16_8_ < (long)uVar84) {
                    uVar45 = uVar84;
                  }
                  if ((long)uVar32 < (long)uVar54) {
                    uVar32 = uVar54;
                  }
                  *(undefined1 (*) [32])((long)*b_03 + lVar44) = auVar98;
                  *(undefined1 (*) [32])((long)*b_04 + lVar44) = auVar11;
                  auVar104 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar58,
                                                 ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92));
                  auVar65._8_8_ = 0;
                  auVar65._0_8_ = uVar32;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = uVar45;
                  auVar58 = vpunpcklqdq_avx(auVar80,auVar65);
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar22;
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = uVar28;
                  auVar92 = vpunpcklqdq_avx(auVar81,auVar89);
                  auVar11 = vpcmpgtq_avx2(auVar105,auVar63);
                  auVar64 = vblendvpd_avx(auVar107._0_32_,auVar64,auVar11);
                  auVar107 = ZEXT3264(auVar64);
                  auVar109 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar58,
                                                 ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92));
                  auVar64 = vblendvpd_avx(auVar106._0_32_,auVar95,auVar11);
                  auVar106 = ZEXT3264(auVar64);
                  auVar64 = vpsubq_avx2(auVar108._0_32_,auVar72);
                  auVar64 = vblendvpd_avx(auVar64,auVar111,auVar11);
                  auVar108 = ZEXT3264(auVar64);
                  auVar64 = *(undefined1 (*) [32])((long)*palVar52 + lVar44);
                  auVar95 = *(undefined1 (*) [32])((long)*ptr_00 + lVar44);
                  auVar11 = *(undefined1 (*) [32])((long)*ptr_01 + lVar44);
                  auVar105 = *(undefined1 (*) [32])((long)*ptr_02 + lVar44);
                  lVar44 = lVar44 + 0x20;
                } while (lVar21 != lVar44);
                auVar11._8_4_ = open;
                auVar11._0_8_ = uVar27;
                auVar11._12_4_ = 0;
                auVar11._16_4_ = open;
                auVar11._20_4_ = 0;
                auVar11._24_4_ = open;
                auVar11._28_4_ = 0;
                uVar14 = 0;
                do {
                  uVar32 = (long)iVar46;
                  if (s2_beg == 0) {
                    uVar32 = ptr_04[uVar48 + 1] - uVar27;
                  }
                  auVar95 = vpermpd_avx2((undefined1  [32])palVar52[uVar35],0x90);
                  auVar63 = vpermq_avx2(auVar109._0_32_,0x90);
                  auVar105 = auVar107._0_32_;
                  auVar64 = vperm2f128_avx(auVar105,auVar105,8);
                  auVar64 = vpalignr_avx2(auVar105,auVar64,8);
                  auVar107 = ZEXT3264(auVar64);
                  auVar105 = auVar106._0_32_;
                  auVar64 = vperm2f128_avx(auVar105,auVar105,8);
                  auVar64 = vpalignr_avx2(auVar105,auVar64,8);
                  auVar106 = ZEXT3264(auVar64);
                  auVar105 = vpermpd_avx2(auVar108._0_32_,0x90);
                  auVar64 = vblendpd_avx(auVar95,ZEXT832((ulong)ptr_04[uVar48]),1);
                  auVar95 = vpblendd_avx2(auVar63,ZEXT832(uVar32),3);
                  auVar109 = ZEXT3264(auVar95);
                  auVar95 = vblendpd_avx(auVar105,SUB6432(ZEXT864(1),0),1);
                  auVar108 = ZEXT3264(auVar95);
                  lVar44 = 0;
                  do {
                    auVar64 = vpaddq_avx2(auVar64,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar44 + lVar43));
                    uVar45 = auVar109._0_8_;
                    uVar32 = *(ulong *)((long)*ptr + lVar44);
                    uVar22 = uVar45;
                    if ((long)uVar45 < (long)uVar32) {
                      uVar22 = uVar32;
                    }
                    uVar28 = vpextrq_avx(auVar109._0_16_,1);
                    uVar32 = *(ulong *)((long)*ptr + lVar44 + 8);
                    if ((long)uVar28 < (long)uVar32) {
                      uVar28 = uVar32;
                    }
                    uVar32 = *(ulong *)((long)*ptr + lVar44 + 0x10);
                    uVar50 = auVar109._16_8_;
                    uVar53 = uVar50;
                    if ((long)uVar50 < (long)uVar32) {
                      uVar53 = uVar32;
                    }
                    uVar29 = vpextrq_avx(auVar109._16_16_,1);
                    uVar32 = *(ulong *)((long)*ptr + lVar44 + 0x18);
                    if ((long)uVar29 < (long)uVar32) {
                      uVar29 = uVar32;
                    }
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar29;
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = uVar53;
                    auVar58 = vpunpcklqdq_avx(auVar66,auVar59);
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar28;
                    auVar73._8_8_ = 0;
                    auVar73._0_8_ = uVar22;
                    auVar92 = vpunpcklqdq_avx(auVar73,auVar67);
                    auVar111._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92;
                    auVar58 = ZEXT116(1) * auVar58;
                    auVar111._16_16_ = auVar58;
                    *(undefined1 (*) [32])((long)*ptr + lVar44) = auVar111;
                    auVar63._0_8_ = -(ulong)(auVar111._0_8_ == uVar45);
                    auVar63._8_8_ = -(ulong)(auVar111._8_8_ == auVar109._8_8_);
                    auVar63._16_8_ = -(ulong)(auVar58._0_8_ == uVar50);
                    auVar63._24_8_ = -(ulong)(auVar58._8_8_ == auVar109._24_8_);
                    auVar72._0_8_ = -(ulong)(auVar111._0_8_ == auVar64._0_8_);
                    auVar72._8_8_ = -(ulong)(auVar111._8_8_ == auVar64._8_8_);
                    auVar72._16_8_ = -(ulong)(auVar58._0_8_ == auVar64._16_8_);
                    auVar72._24_8_ = -(ulong)(auVar58._8_8_ == auVar64._24_8_);
                    auVar63 = vpandn_avx2(auVar72,auVar63);
                    auVar95 = vblendvpd_avx(*(undefined1 (*) [32])((long)*local_358 + lVar44),
                                            auVar107._0_32_,auVar63);
                    *(undefined1 (*) [32])((long)*local_358 + lVar44) = auVar95;
                    auVar105 = vblendvpd_avx(*(undefined1 (*) [32])((long)*local_360 + lVar44),
                                             auVar106._0_32_,auVar63);
                    *(undefined1 (*) [32])((long)*local_360 + lVar44) = auVar105;
                    auVar63 = vblendvpd_avx(*(undefined1 (*) [32])((long)*local_368 + lVar44),
                                            auVar108._0_32_,auVar63);
                    *(undefined1 (*) [32])((long)*local_368 + lVar44) = auVar63;
                    uVar32 = auVar99._0_8_;
                    if ((long)uVar22 <= (long)auVar99._0_8_) {
                      uVar32 = uVar22;
                    }
                    uVar45 = vpextrq_avx(auVar99._0_16_,1);
                    if ((long)uVar28 <= (long)uVar45) {
                      uVar45 = uVar28;
                    }
                    uVar50 = auVar99._16_8_;
                    if ((long)uVar53 <= (long)auVar99._16_8_) {
                      uVar50 = uVar53;
                    }
                    uVar30 = vpextrq_avx(auVar99._16_16_,1);
                    if ((long)uVar29 <= (long)uVar30) {
                      uVar30 = uVar29;
                    }
                    auVar72 = vpcmpeqd_avx2(ZEXT832(uVar22),ZEXT832(uVar22));
                    uVar31 = auVar104._0_8_;
                    if ((long)auVar104._0_8_ <= (long)uVar22) {
                      uVar31 = uVar22;
                    }
                    uVar22 = vpextrq_avx(auVar104._0_16_,1);
                    if ((long)uVar22 <= (long)uVar28) {
                      uVar22 = uVar28;
                    }
                    uVar28 = auVar104._16_8_;
                    if ((long)auVar104._16_8_ <= (long)uVar53) {
                      uVar28 = uVar53;
                    }
                    uVar53 = vpextrq_avx(auVar104._16_16_,1);
                    if ((long)uVar53 <= (long)uVar29) {
                      uVar53 = uVar29;
                    }
                    if ((long)uVar31 <= (long)auVar95._0_8_) {
                      uVar31 = auVar95._0_8_;
                    }
                    uVar29 = vpextrq_avx(auVar95._0_16_,1);
                    if ((long)uVar22 <= (long)uVar29) {
                      uVar22 = uVar29;
                    }
                    if ((long)uVar28 <= (long)auVar95._16_8_) {
                      uVar28 = auVar95._16_8_;
                    }
                    uVar29 = vpextrq_avx(auVar95._16_16_,1);
                    if ((long)uVar53 <= (long)uVar29) {
                      uVar53 = uVar29;
                    }
                    if ((long)uVar31 <= (long)auVar105._0_8_) {
                      uVar31 = auVar105._0_8_;
                    }
                    uVar29 = vpextrq_avx(auVar105._0_16_,1);
                    if ((long)uVar22 <= (long)uVar29) {
                      uVar22 = uVar29;
                    }
                    if ((long)uVar28 <= (long)auVar105._16_8_) {
                      uVar28 = auVar105._16_8_;
                    }
                    uVar29 = vpextrq_avx(auVar105._16_16_,1);
                    if ((long)uVar53 <= (long)uVar29) {
                      uVar53 = uVar29;
                    }
                    if ((long)uVar31 <= (long)auVar63._0_8_) {
                      uVar31 = auVar63._0_8_;
                    }
                    uVar29 = vpextrq_avx(auVar63._0_16_,1);
                    if ((long)uVar22 <= (long)uVar29) {
                      uVar22 = uVar29;
                    }
                    if ((long)uVar28 <= (long)auVar63._16_8_) {
                      uVar28 = auVar63._16_8_;
                    }
                    uVar29 = vpextrq_avx(auVar63._16_16_,1);
                    if ((long)uVar53 <= (long)uVar29) {
                      uVar53 = uVar29;
                    }
                    auVar111 = vpsubq_avx2(auVar111,auVar11);
                    auVar98 = vpsubq_avx2(auVar109._0_32_,auVar62);
                    auVar111 = vpcmpgtq_avx2(auVar111,auVar98);
                    uVar51 = ((uint)(SUB321(auVar111 >> 7,0) & 1) |
                              (uint)(SUB321(auVar111 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar111 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar111 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar111 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar111 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar111 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar111 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar111 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar111 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar111 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar111 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar111 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar111 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar111 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar111 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar111 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar111 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar111 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar111 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar111 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar111 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar111 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar111 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar111 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar111 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar111 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar111 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar111 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar111 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar111 >> 0xf7,0) & 1) << 0x1e |
                             (uint)(byte)(auVar111[0x1f] >> 7) << 0x1f) ^ 0xffffffff;
                    if (uVar51 == 0) {
                      iVar49 = 0x27;
                    }
                    else {
                      auVar64 = vblendvpd_avx(auVar107._0_32_,auVar95,auVar111);
                      auVar107 = ZEXT3264(auVar64);
                      auVar64 = vblendvpd_avx(auVar106._0_32_,auVar105,auVar111);
                      auVar106 = ZEXT3264(auVar64);
                      auVar64 = vblendvpd_avx(auVar108._0_32_,auVar63,auVar111);
                      auVar64 = vpsubq_avx2(auVar64,auVar72);
                      auVar108 = ZEXT3264(auVar64);
                      auVar64 = *(undefined1 (*) [32])((long)*palVar52 + lVar44);
                      iVar49 = 0;
                      auVar109 = ZEXT3264(auVar98);
                    }
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar30;
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = uVar50;
                    auVar58 = vpunpcklqdq_avx(auVar68,auVar60);
                    auVar69._8_8_ = 0;
                    auVar69._0_8_ = uVar45;
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = uVar32;
                    auVar92 = vpunpcklqdq_avx(auVar74,auVar69);
                    auVar98._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92;
                    auVar98._16_16_ = ZEXT116(1) * auVar58;
                    auVar99._0_32_ = auVar98;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar53;
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar28;
                    auVar58 = vpunpcklqdq_avx(auVar70,auVar61);
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar22;
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar31;
                    auVar92 = vpunpcklqdq_avx(auVar75,auVar71);
                    auVar103._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar92;
                    auVar103._16_16_ = ZEXT116(1) * auVar58;
                    auVar104._0_32_ = auVar103;
                    if (uVar51 == 0) goto LAB_00770fd8;
                    lVar44 = lVar44 + 0x20;
                  } while (lVar21 != lVar44);
                  iVar49 = 0;
LAB_00770fd8:
                } while ((iVar49 == 0) && (bVar57 = uVar14 < 3, uVar14 = uVar14 + 1, bVar57));
                auVar95 = vpcmpgtq_avx2((undefined1  [32])ptr[uVar34],auVar96._0_32_);
                auVar64 = vblendvpd_avx(auVar96._0_32_,(undefined1  [32])ptr[uVar34],auVar95);
                auVar58 = auVar64._16_16_;
                auVar96 = ZEXT3264(auVar64);
                auVar64 = vblendvpd_avx(auVar91._0_32_,(undefined1  [32])local_358[uVar34],auVar95);
                auVar92 = auVar64._16_16_;
                auVar91 = ZEXT3264(auVar64);
                auVar64 = vblendvpd_avx(auVar83._0_32_,(undefined1  [32])local_360[uVar34],auVar95);
                auVar93 = auVar64._16_16_;
                auVar83 = ZEXT3264(auVar64);
                auVar64 = vblendvpd_avx(auVar77._0_32_,(undefined1  [32])local_368[uVar34],auVar95);
                auVar112 = auVar64._16_16_;
                auVar77 = ZEXT3264(auVar64);
                auVar10._8_8_ = -(ulong)(iVar24 == 2);
                auVar10._0_8_ = -(ulong)(iVar24 == 3);
                auVar10._16_8_ = -(ulong)(iVar24 == 1);
                auVar10._24_8_ = -(ulong)(iVar24 == 0);
                auVar10 = auVar10 & auVar95;
                if ((((auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') || SUB321(auVar10 >> 0xbf,0) != '\0') ||
                    auVar10[0x1f] < '\0') {
                  iVar25 = (int)uVar48;
                }
                uVar48 = uVar48 + 1;
                palVar19 = palVar52;
                b = local_358;
                b_01 = local_368;
                b_00 = local_360;
                if (uVar48 == uVar38) {
                  if (s2_end == 0) {
                    lVar23 = 0;
                    lVar33 = 0;
                    lVar40 = 0;
                    lVar21 = lVar20;
                  }
                  else {
                    if (iVar16 < 3) {
                      iVar46 = 1;
                      if (1 < iVar24) {
                        iVar46 = iVar24;
                      }
                      do {
                        auVar64 = auVar96._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar58 = auVar62._16_16_;
                        auVar96 = ZEXT3264(auVar62);
                        auVar64 = auVar91._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar92 = auVar62._16_16_;
                        auVar91 = ZEXT3264(auVar62);
                        auVar64 = auVar83._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar93 = auVar62._16_16_;
                        auVar83 = ZEXT3264(auVar62);
                        auVar64 = auVar77._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar112 = auVar62._16_16_;
                        auVar77 = ZEXT3264(auVar62);
                        iVar46 = iVar46 + -1;
                      } while (iVar46 != 0);
                    }
                    lVar21 = vpextrq_avx(auVar58,1);
                    lVar23 = vpextrq_avx(auVar92,1);
                    lVar33 = vpextrq_avx(auVar93,1);
                    lVar40 = vpextrq_avx(auVar112,1);
                  }
                  iVar36 = (int)lVar40;
                  iVar26 = (int)lVar33;
                  iVar49 = (int)lVar23;
                  iVar46 = iVar15;
                  if ((s1_end != 0) && (((ulong)uVar5 + 3 & 0x7ffffffc) != 0)) {
                    uVar38 = 0;
                    lVar43 = lVar21;
                    iVar55 = iVar25;
                    do {
                      iVar49 = ((uint)uVar38 & 3) * uVar41 + ((uint)(uVar38 >> 2) & 0x3fffffff);
                      lVar21 = lVar43;
                      iVar25 = iVar55;
                      if (iVar49 < (int)uVar5) {
                        lVar44 = (*ptr)[uVar38];
                        lVar21 = lVar44;
                        iVar25 = iVar17;
                        if ((lVar43 < lVar44) ||
                           (((lVar21 = lVar43, iVar25 = iVar55, lVar44 == lVar43 &&
                             (iVar55 == iVar17)) && (iVar49 < iVar46)))) {
                          lVar23 = (*local_358)[uVar38];
                          lVar33 = (*local_360)[uVar38];
                          lVar40 = (*local_368)[uVar38];
                          iVar46 = iVar49;
                        }
                      }
                      iVar36 = (int)lVar40;
                      iVar26 = (int)lVar33;
                      iVar49 = (int)lVar23;
                      uVar38 = uVar38 + 1;
                      lVar43 = lVar21;
                      iVar55 = iVar25;
                    } while ((uVar41 & 0x1fffffff) << 2 != (int)uVar38);
                  }
                  iVar55 = (int)lVar21;
                  if (s2_end == 0 && s1_end == 0) {
                    auVar58 = SUB3216(ptr[uVar34],0x10);
                    auVar96 = ZEXT3264((undefined1  [32])ptr[uVar34]);
                    auVar92 = SUB3216(local_358[uVar34],0x10);
                    auVar91 = ZEXT3264((undefined1  [32])local_358[uVar34]);
                    auVar93 = SUB3216(local_360[uVar34],0x10);
                    auVar83 = ZEXT3264((undefined1  [32])local_360[uVar34]);
                    auVar112 = SUB3216(local_368[uVar34],0x10);
                    auVar77 = ZEXT3264((undefined1  [32])local_368[uVar34]);
                    if (iVar16 < 3) {
                      iVar25 = 1;
                      if (1 < iVar24) {
                        iVar25 = iVar24;
                      }
                      do {
                        auVar64 = auVar96._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar58 = auVar62._16_16_;
                        auVar96 = ZEXT3264(auVar62);
                        auVar64 = auVar91._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar92 = auVar62._16_16_;
                        auVar91 = ZEXT3264(auVar62);
                        auVar64 = auVar83._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar93 = auVar62._16_16_;
                        auVar83 = ZEXT3264(auVar62);
                        auVar64 = auVar77._0_32_;
                        auVar62 = vperm2i128_avx2(auVar64,auVar64,8);
                        auVar62 = vpalignr_avx2(auVar64,auVar62,8);
                        auVar112 = auVar62._16_16_;
                        auVar77 = ZEXT3264(auVar62);
                        iVar25 = iVar25 + -1;
                      } while (iVar25 != 0);
                    }
                    uVar56 = vpextrq_avx(auVar58,1);
                    iVar55 = (int)uVar56;
                    uVar56 = vpextrq_avx(auVar92,1);
                    iVar49 = (int)uVar56;
                    uVar56 = vpextrq_avx(auVar93,1);
                    iVar26 = (int)uVar56;
                    uVar56 = vpextrq_avx(auVar112,1);
                    iVar36 = (int)uVar56;
                    iVar25 = iVar17;
                    iVar46 = iVar15;
                  }
                  auVar12._8_8_ = lVar20;
                  auVar12._0_8_ = lVar20;
                  auVar12._16_8_ = lVar20;
                  auVar12._24_8_ = lVar20;
                  auVar62 = vpcmpgtq_avx2(auVar12,auVar98);
                  auVar13._8_8_ = lVar37;
                  auVar13._0_8_ = lVar37;
                  auVar13._16_8_ = lVar37;
                  auVar13._24_8_ = lVar37;
                  auVar64 = vpcmpgtq_avx2(auVar103,auVar13);
                  auVar62 = vpor_avx2(auVar64,auVar62);
                  if ((((auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar62 >> 0x7f,0) != '\0') || SUB321(auVar62 >> 0xbf,0) != '\0') ||
                      auVar62[0x1f] < '\0') {
                    *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                    iVar55 = 0;
                    iVar49 = 0;
                    iVar26 = 0;
                    iVar36 = 0;
                    iVar25 = 0;
                    iVar46 = 0;
                  }
                  ppVar18->score = iVar55;
                  ppVar18->end_query = iVar46;
                  ppVar18->end_ref = iVar25;
                  ((ppVar18->field_4).stats)->matches = iVar49;
                  ((ppVar18->field_4).stats)->similar = iVar26;
                  ((ppVar18->field_4).stats)->length = iVar36;
                  parasail_free(ptr_04);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_368);
                  parasail_free(ptr_01);
                  parasail_free(local_360);
                  parasail_free(ptr_00);
                  parasail_free(local_358);
                  parasail_free(palVar52);
                  parasail_free(ptr);
                  return ppVar18;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}